

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

Iterator * __thiscall leveldb::VersionSet::MakeInputIterator(VersionSet *this,Compaction *c)

{
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *pvVar1;
  int iVar2;
  Iterator **children;
  pointer ppFVar3;
  Iterator *pIVar4;
  long lVar5;
  int n;
  ulong uVar6;
  long lVar7;
  long in_FS_OFFSET;
  bool bVar8;
  ReadOptions options;
  ReadOptions local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.snapshot = (Snapshot *)0x0;
  local_48.fill_cache = false;
  local_48.verify_checksums = this->options_->paranoid_checks;
  iVar2 = 2;
  if (c->level_ == 0) {
    iVar2 = (int)((ulong)((long)c->inputs_[0].
                                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)c->inputs_[0].
                               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1;
  }
  uVar6 = 0xffffffffffffffff;
  if (-1 < iVar2) {
    uVar6 = (long)iVar2 * 8;
  }
  children = (Iterator **)operator_new__(uVar6);
  n = 0;
  lVar7 = 0;
  do {
    if (c->inputs_[lVar7].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        c->inputs_[lVar7].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pvVar1 = c->inputs_ + lVar7;
      if (c->level_ + (int)lVar7 == 0) {
        ppFVar3 = (pvVar1->
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((pvVar1->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_finish != ppFVar3) {
          uVar6 = 0;
          do {
            pIVar4 = TableCache::NewIterator
                               (this->table_cache_,&local_48,ppFVar3[uVar6]->number,
                                ppFVar3[uVar6]->file_size,(Table **)0x0);
            children[(long)n + uVar6] = pIVar4;
            uVar6 = uVar6 + 1;
            ppFVar3 = (pvVar1->
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          } while (uVar6 < (ulong)((long)(pvVar1->
                                         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3
                                  >> 3));
          n = n + (int)uVar6;
        }
      }
      else {
        pIVar4 = (Iterator *)operator_new(0x58);
        Iterator::Iterator(pIVar4);
        pIVar4->_vptr_Iterator = (_func_int **)&PTR__LevelFileNumIterator_00b184c0;
        pIVar4[1]._vptr_Iterator = (_func_int **)&PTR__Comparator_00b18360;
        pIVar4[1].cleanup_head_.function = (CleanupFunction)(this->icmp_).user_comparator_;
        pIVar4[1].cleanup_head_.arg1 = pvVar1;
        *(int *)&pIVar4[1].cleanup_head_.arg2 =
             (int)((ulong)((long)(pvVar1->
                                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar1->
                                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3);
        pIVar4 = NewTwoLevelIterator(pIVar4,GetFileIterator,this->table_cache_,&local_48);
        lVar5 = (long)n;
        n = n + 1;
        children[lVar5] = pIVar4;
      }
    }
    bVar8 = lVar7 == 0;
    lVar7 = lVar7 + 1;
  } while (bVar8);
  if (n <= iVar2) {
    pIVar4 = NewMergingIterator(&(this->icmp_).super_Comparator,children,n);
    operator_delete__(children);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return pIVar4;
    }
    __stack_chk_fail();
  }
  __assert_fail("num <= space",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                ,0x4d9,"Iterator *leveldb::VersionSet::MakeInputIterator(Compaction *)");
}

Assistant:

Iterator* VersionSet::MakeInputIterator(Compaction* c) {
  ReadOptions options;
  options.verify_checksums = options_->paranoid_checks;
  options.fill_cache = false;

  // Level-0 files have to be merged together.  For other levels,
  // we will make a concatenating iterator per level.
  // TODO(opt): use concatenating iterator for level-0 if there is no overlap
  const int space = (c->level() == 0 ? c->inputs_[0].size() + 1 : 2);
  Iterator** list = new Iterator*[space];
  int num = 0;
  for (int which = 0; which < 2; which++) {
    if (!c->inputs_[which].empty()) {
      if (c->level() + which == 0) {
        const std::vector<FileMetaData*>& files = c->inputs_[which];
        for (size_t i = 0; i < files.size(); i++) {
          list[num++] = table_cache_->NewIterator(options, files[i]->number,
                                                  files[i]->file_size);
        }
      } else {
        // Create concatenating iterator for the files from this level
        list[num++] = NewTwoLevelIterator(
            new Version::LevelFileNumIterator(icmp_, &c->inputs_[which]),
            &GetFileIterator, table_cache_, options);
      }
    }
  }
  assert(num <= space);
  Iterator* result = NewMergingIterator(&icmp_, list, num);
  delete[] list;
  return result;
}